

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_dlib.cpp
# Opt level: O0

void dlib::cpu::compute_adam_update
               (size_t begin,size_t end,tensor *s,tensor *m,tensor *v,float t,float learning_rate,
               float weight_decay,float momentum1,float momentum2,tensor *params,tensor *params_grad
               )

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  size_t sVar6;
  ostream *poVar7;
  undefined8 uVar8;
  ostream *poVar9;
  string *a;
  undefined4 extraout_var;
  long lVar11;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  tensor *in_RCX;
  tensor *in_RDX;
  ulong in_RSI;
  ulong in_RDI;
  tensor *in_R8;
  tensor *in_R9;
  uint in_XMM0_Da;
  float fVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  float in_XMM1_Da;
  float in_XMM2_Da;
  float in_XMM3_Da;
  float in_XMM4_Da;
  tensor *in_stack_00000008;
  float g;
  size_t i;
  float *ppgrad;
  float *pparams;
  float *ps;
  float *pv;
  float *pm;
  float alpha;
  float eps;
  ostringstream dlib_o_out_1;
  ostringstream dlib_o_out;
  string *in_stack_fffffffffffffb40;
  undefined8 in_stack_fffffffffffffb48;
  error_type eVar16;
  fatal_error *in_stack_fffffffffffffb50;
  ulong local_3d0;
  ostream local_370;
  undefined1 local_1f1;
  ostream local_1c0;
  tensor *local_48;
  float local_3c;
  float local_38;
  float local_34;
  float local_30;
  uint local_2c;
  tensor *local_28;
  tensor *local_20;
  tensor *local_18;
  ulong local_10;
  ulong local_8;
  long lVar10;
  undefined4 extraout_var_00;
  
  eVar16 = (error_type)((ulong)in_stack_fffffffffffffb48 >> 0x20);
  local_48 = in_R9;
  local_3c = in_XMM4_Da;
  local_38 = in_XMM3_Da;
  local_34 = in_XMM2_Da;
  local_30 = in_XMM1_Da;
  local_2c = in_XMM0_Da;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  sVar5 = tensor::size(in_RDX);
  sVar6 = tensor::size(local_20);
  if (sVar5 == sVar6) {
    sVar5 = tensor::size(local_18);
    sVar6 = tensor::size(local_28);
    if (sVar5 == sVar6) {
      sVar5 = tensor::size(local_18);
      sVar6 = tensor::size(local_48);
      if (sVar5 == sVar6) {
        sVar5 = tensor::size(local_18);
        sVar6 = tensor::size(in_stack_00000008);
        uVar1 = local_10;
        if (sVar5 == sVar6) {
          if (local_8 <= local_10) {
            sVar5 = tensor::size(local_48);
            if (uVar1 <= sVar5) {
              dVar13 = std::pow((double)(ulong)(uint)local_3c,(double)(ulong)local_2c);
              dVar13 = std::sqrt((double)(ulong)(uint)(1.0 - SUB84(dVar13,0)));
              dVar14 = std::pow((double)(ulong)(uint)local_38,(double)(ulong)local_2c);
              iVar2 = (*local_20->_vptr_tensor[3])();
              lVar10 = CONCAT44(extraout_var,iVar2);
              iVar2 = (*local_28->_vptr_tensor[3])();
              lVar11 = CONCAT44(extraout_var_00,iVar2);
              iVar2 = (*local_18->_vptr_tensor[4])();
              iVar3 = (*local_48->_vptr_tensor[2])();
              iVar4 = (*in_stack_00000008->_vptr_tensor[2])();
              for (local_3d0 = local_8; local_3d0 < local_10; local_3d0 = local_3d0 + 1) {
                fVar12 = local_34 * *(float *)(CONCAT44(extraout_var_02,iVar3) + local_3d0 * 4) +
                         *(float *)(CONCAT44(extraout_var_03,iVar4) + local_3d0 * 4);
                *(float *)(lVar10 + local_3d0 * 4) =
                     local_38 * *(float *)(lVar10 + local_3d0 * 4) + (1.0 - local_38) * fVar12;
                *(float *)(lVar11 + local_3d0 * 4) =
                     local_3c * *(float *)(lVar11 + local_3d0 * 4) +
                     (1.0 - local_3c) * fVar12 * fVar12;
                fVar12 = *(float *)(lVar10 + local_3d0 * 4);
                dVar15 = std::sqrt((double)(ulong)*(uint *)(lVar11 + local_3d0 * 4));
                *(float *)(CONCAT44(extraout_var_01,iVar2) + local_3d0 * 4) =
                     (-((local_30 * SUB84(dVar13,0)) / (1.0 - SUB84(dVar14,0))) * fVar12) /
                     (SUB84(dVar15,0) + 1e-08);
              }
              return;
            }
          }
          dlib_assert_breakpoint();
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_370);
          poVar7 = std::operator<<(&local_370,"\n\nError detected at line ");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x26f);
          std::operator<<(poVar7,".\n");
          poVar7 = std::operator<<(&local_370,"Error detected in file ");
          poVar7 = std::operator<<(poVar7,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/e-fominov[P]dlib/dlib/dnn/cpu_dlib.cpp"
                                  );
          std::operator<<(poVar7,".\n");
          poVar7 = std::operator<<(&local_370,"Error detected in function ");
          poVar7 = std::operator<<(poVar7,
                                   "void dlib::cpu::compute_adam_update(size_t, size_t, tensor &, tensor &, tensor &, const float, const float, const float, const float, const float, const tensor &, const tensor &)"
                                  );
          std::operator<<(poVar7,".\n\n");
          poVar7 = std::operator<<(&local_370,"Failing expression was ");
          poVar7 = std::operator<<(poVar7,"begin <= end && end <= params.size()");
          std::operator<<(poVar7,".\n");
          poVar7 = (ostream *)std::ostream::operator<<(&local_370,std::boolalpha);
          poVar9 = std::operator<<(poVar7,"");
          std::operator<<(poVar9,"\n");
          eVar16 = (error_type)((ulong)poVar9 >> 0x20);
          a = (string *)__cxa_allocate_exception(0x30);
          std::__cxx11::ostringstream::str();
          fatal_error::fatal_error((fatal_error *)poVar7,eVar16,a);
          __cxa_throw(a,&fatal_error::typeinfo,fatal_error::~fatal_error);
        }
      }
    }
  }
  dlib_assert_breakpoint();
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c0);
  poVar7 = std::operator<<(&local_1c0,"\n\nError detected at line ");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x26e);
  std::operator<<(poVar7,".\n");
  poVar7 = std::operator<<(&local_1c0,"Error detected in file ");
  poVar7 = std::operator<<(poVar7,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/e-fominov[P]dlib/dlib/dnn/cpu_dlib.cpp"
                          );
  std::operator<<(poVar7,".\n");
  poVar7 = std::operator<<(&local_1c0,"Error detected in function ");
  poVar7 = std::operator<<(poVar7,
                           "void dlib::cpu::compute_adam_update(size_t, size_t, tensor &, tensor &, tensor &, const float, const float, const float, const float, const float, const tensor &, const tensor &)"
                          );
  std::operator<<(poVar7,".\n\n");
  poVar7 = std::operator<<(&local_1c0,"Failing expression was ");
  poVar7 = std::operator<<(poVar7,
                           "s.size() == m.size() && s.size() == v.size() && s.size() == params.size() && s.size() == params_grad.size()"
                          );
  std::operator<<(poVar7,".\n");
  poVar7 = (ostream *)std::ostream::operator<<(&local_1c0,std::boolalpha);
  poVar7 = std::operator<<(poVar7,"");
  std::operator<<(poVar7,"\n");
  local_1f1 = 1;
  uVar8 = __cxa_allocate_exception(0x30);
  std::__cxx11::ostringstream::str();
  fatal_error::fatal_error(in_stack_fffffffffffffb50,eVar16,in_stack_fffffffffffffb40);
  local_1f1 = 0;
  __cxa_throw(uVar8,&fatal_error::typeinfo,fatal_error::~fatal_error);
}

Assistant:

void compute_adam_update (
            size_t begin,
            size_t end,
            tensor& s,
            tensor& m,
            tensor& v,
            const float t,
            const float learning_rate,
            const float weight_decay,
            const float momentum1,
            const float momentum2,
            const tensor& params,
            const tensor& params_grad
        )
        {
            DLIB_CASSERT(s.size() == m.size() &&
                         s.size() == v.size() &&
                         s.size() == params.size() &&
                         s.size() == params_grad.size());
            DLIB_CASSERT(begin <= end && end <= params.size());
            const float eps = 1e-8;
            const float alpha = learning_rate*std::sqrt(1-std::pow(momentum2,t))/(1-std::pow(momentum1, t));

            // The loop is equivalent to doing this:
            //   m = momentum1*m + (1-momentum1)    *   (weight_decay*params + params_grad);
            //   v = momentum2*v + (1-momentum2)*squared(weight_decay*params + params_grad);
            //   s = -alpha*m/(sqrt(v) + eps);
            auto pm = m.host();
            auto pv = v.host();
            auto ps = s.host_write_only();
            auto pparams = params.host();
            auto ppgrad = params_grad.host();
            for (size_t i = begin; i < end; ++i)
            {
                float g = weight_decay*pparams[i] + ppgrad[i];
                pm[i] = momentum1*pm[i] + (1-momentum1)*g;
                pv[i] = momentum2*pv[i] + (1-momentum2)*g*g;
                ps[i] = -alpha*pm[i]/(std::sqrt(pv[i]) + eps);
            }
        }